

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

upb_Array * upb_Array_New(upb_Arena *a,upb_CType type)

{
  int elem_size_lg2;
  upb_Array *puVar1;
  int lg2;
  upb_CType type_local;
  upb_Arena *a_local;
  
  elem_size_lg2 = _upb_CType_SizeLg2_dont_copy_me__upb_internal_use_only(type);
  puVar1 = _upb_Array_New_dont_copy_me__upb_internal_use_only(a,4,elem_size_lg2);
  return puVar1;
}

Assistant:

upb_Array* upb_Array_New(upb_Arena* a, upb_CType type) {
  const int lg2 = UPB_PRIVATE(_upb_CType_SizeLg2)(type);
  return UPB_PRIVATE(_upb_Array_New)(a, 4, lg2);
}